

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::RawStringStmt::clone
          (RawStringStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_type *psVar1;
  pointer this_00;
  _func_int **local_38;
  pointer local_30;
  undefined1 local_21;
  
  std::__shared_ptr<kratos::RawStringStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::RawStringStmt>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            ((__shared_ptr<kratos::RawStringStmt,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<kratos::RawStringStmt> *)&local_21,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(__fn + 0xc0));
  this_00 = local_30;
  if (local_30 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_30->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_30->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  *(undefined4 *)(local_38 + 4) = *(undefined4 *)(__fn + 0x20);
  std::__cxx11::string::_M_assign((string *)(local_38 + 5));
  if (this_00 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  (this->super_Stmt).super_IRNode._vptr_IRNode = local_38;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_30;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> RawStringStmt::clone() const {
    auto stmt = std::make_shared<RawStringStmt>(stmts_);
    copy_meta(stmt);
    return stmt;
}